

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * str2num(cTValue *o,TValue *n)

{
  int iVar1;
  TValue *n_local;
  cTValue *o_local;
  
  o_local = o;
  if ((0xfffffff1 < (uint)((int)(o->field_4).it >> 0xf)) &&
     (((int)(o->field_4).it >> 0xf != -5 ||
      (iVar1 = lj_strscan_num((GCstr *)(o->u64 & 0x7fffffffffff),n), o_local = n, iVar1 == 0)))) {
    o_local = (cTValue *)0x0;
  }
  return o_local;
}

Assistant:

static cTValue *str2num(cTValue *o, TValue *n)
{
  if (tvisnum(o))
    return o;
  else if (tvisint(o))
    return (setnumV(n, (lua_Number)intV(o)), n);
  else if (tvisstr(o) && lj_strscan_num(strV(o), n))
    return n;
  else
    return NULL;
}